

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gia.h
# Opt level: O1

int Gia_ManAppendAnd(Gia_Man_t *p,int iLit0,int iLit1)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  uint uVar3;
  Gia_Obj_t *pFanout;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  
  pFanout = Gia_ManAppendObj(p);
  if (iLit0 < 0) {
LAB_008b5059:
    __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x2a8,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
  }
  uVar4 = (uint)iLit0 >> 1;
  iVar1 = p->nObjs;
  if (iVar1 <= (int)uVar4) goto LAB_008b5059;
  if (iLit1 < 0) {
    __assert_fail("Lit >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                  ,0x12f,"int Abc_Lit2Var(int)");
  }
  uVar3 = (uint)iLit1 >> 1;
  if (iVar1 <= (int)uVar3) {
    __assert_fail("iLit1 >= 0 && Abc_Lit2Var(iLit1) < Gia_ManObjNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x2a9,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
  }
  if ((uVar4 == uVar3) && (p->fGiaSimple == 0)) {
    __assert_fail("p->fGiaSimple || Abc_Lit2Var(iLit0) != Abc_Lit2Var(iLit1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x2aa,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
  }
  pGVar2 = p->pObjs;
  iVar7 = (int)pFanout;
  if (iLit0 < iLit1) {
    if (pGVar2 + iVar1 <= pFanout || pFanout < pGVar2) goto LAB_008b503a;
    uVar6 = *(ulong *)pFanout;
    uVar8 = (ulong)((iLit0 & 1U) << 0x1d |
                   ((uint)(iVar7 - (int)pGVar2) >> 2) * -0x55555555 - uVar4 & 0x1fffffff);
    *(ulong *)pFanout = uVar8 | uVar6 & 0xffffffffc0000000;
    pGVar2 = p->pObjs;
    if ((pFanout < pGVar2) || (pGVar2 + p->nObjs <= pFanout)) goto LAB_008b503a;
    uVar5 = (ulong)(((uint)(iVar7 - (int)pGVar2) >> 2) * -0x55555555 - uVar3 & 0x1fffffff) << 0x20;
    *(ulong *)pFanout = uVar8 | uVar6 & 0xe0000000c0000000 | uVar5;
    uVar10 = (ulong)(iLit1 & 1) << 0x3d;
    uVar5 = uVar8 | uVar6 & 0xc0000000c0000000 | uVar5;
  }
  else {
    if (pGVar2 + iVar1 <= pFanout || pFanout < pGVar2) goto LAB_008b503a;
    uVar6 = *(ulong *)pFanout;
    uVar8 = (ulong)(((uint)(iVar7 - (int)pGVar2) >> 2) * -0x55555555 - uVar4 & 0x1fffffff) << 0x20;
    uVar9 = (ulong)(iLit0 & 1) << 0x3d;
    *(ulong *)pFanout = uVar9 | uVar6 & 0xc0000000ffffffff | uVar8;
    pGVar2 = p->pObjs;
    if ((pFanout < pGVar2) || (pGVar2 + p->nObjs <= pFanout)) goto LAB_008b503a;
    uVar5 = (ulong)(((uint)(iVar7 - (int)pGVar2) >> 2) * -0x55555555 - uVar3 & 0x1fffffff);
    *(ulong *)pFanout = uVar9 | uVar6 & 0xc0000000e0000000 | uVar8 | uVar5;
    uVar10 = (ulong)((iLit1 & 1U) << 0x1d);
    uVar5 = uVar9 | uVar6 & 0xc0000000c0000000 | uVar8 | uVar5;
  }
  *(ulong *)pFanout = uVar5 | uVar10;
  if (p->pFanData != (int *)0x0) {
    Gia_ObjAddFanout(p,pFanout + -(uVar5 & 0x1fffffff),pFanout);
    Gia_ObjAddFanout(p,pFanout + -((ulong)*(uint *)&pFanout->field_0x4 & 0x1fffffff),pFanout);
  }
  if (p->fSweeper != 0) {
    uVar8 = *(ulong *)pFanout & 0x1fffffff;
    uVar6 = *(ulong *)pFanout >> 0x20 & 0x1fffffff;
    uVar9 = 0x4000000000000000;
    uVar5 = 0x4000000000000000;
    if (((uint)*(ulong *)(pFanout + -uVar8) >> 0x1e & 1) == 0) {
      uVar5 = 0x40000000;
    }
    *(ulong *)(pFanout + -uVar8) = uVar5 | *(ulong *)(pFanout + -uVar8);
    uVar5 = *(ulong *)(pFanout + -uVar6);
    if (((uint)uVar5 >> 0x1e & 1) == 0) {
      uVar9 = 0x40000000;
    }
    *(ulong *)(pFanout + -uVar6) = uVar9 | uVar5;
    uVar6 = *(ulong *)pFanout;
    *(ulong *)pFanout =
         uVar6 & 0x7fffffffffffffff |
         (ulong)(((uint)(uVar6 >> 0x3d) ^ (uint)(uVar5 >> 0x3f)) &
                ((uint)((ulong)*(undefined8 *)(pFanout + -uVar8) >> 0x3f) ^
                (uint)(uVar6 >> 0x1d) & 7)) << 0x3f;
  }
  if (p->fBuiltInSim != 0) {
    uVar6 = *(ulong *)pFanout;
    *(ulong *)pFanout =
         uVar6 & 0x7fffffffffffffff |
         (ulong)(((uint)(uVar6 >> 0x3d) ^
                 (uint)((ulong)*(undefined8 *)(pFanout + -(uVar6 >> 0x20 & 0x1fffffff)) >> 0x3f)) &
                ((uint)((ulong)*(undefined8 *)(pFanout + -(uVar6 & 0x1fffffff)) >> 0x3f) ^
                (uint)(uVar6 >> 0x1d) & 7)) << 0x3f;
    pGVar2 = p->pObjs;
    if ((pFanout < pGVar2) || (pGVar2 + p->nObjs <= pFanout)) goto LAB_008b503a;
    Gia_ManBuiltInSimPerform(p,(int)((ulong)((long)pFanout - (long)pGVar2) >> 2) * -0x55555555);
  }
  if (p->vSuppWords != (Vec_Wrd_t *)0x0) {
    Gia_ManQuantSetSuppAnd(p,pFanout);
  }
  pGVar2 = p->pObjs;
  if ((pGVar2 <= pFanout) && (pFanout < pGVar2 + p->nObjs)) {
    return (int)((ulong)((long)pFanout - (long)pGVar2) >> 2) * 0x55555556;
  }
LAB_008b503a:
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

static inline int Gia_ManAppendAnd( Gia_Man_t * p, int iLit0, int iLit1 )  
{ 
    Gia_Obj_t * pObj = Gia_ManAppendObj( p );
    assert( iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p) );
    assert( iLit1 >= 0 && Abc_Lit2Var(iLit1) < Gia_ManObjNum(p) );
    assert( p->fGiaSimple || Abc_Lit2Var(iLit0) != Abc_Lit2Var(iLit1) );
    if ( iLit0 < iLit1 )
    {
        pObj->iDiff0  = (unsigned)(Gia_ObjId(p, pObj) - Abc_Lit2Var(iLit0));
        pObj->fCompl0 = (unsigned)(Abc_LitIsCompl(iLit0));
        pObj->iDiff1  = (unsigned)(Gia_ObjId(p, pObj) - Abc_Lit2Var(iLit1));
        pObj->fCompl1 = (unsigned)(Abc_LitIsCompl(iLit1));
    }
    else
    {
        pObj->iDiff1  = (unsigned)(Gia_ObjId(p, pObj) - Abc_Lit2Var(iLit0));
        pObj->fCompl1 = (unsigned)(Abc_LitIsCompl(iLit0));
        pObj->iDiff0  = (unsigned)(Gia_ObjId(p, pObj) - Abc_Lit2Var(iLit1));
        pObj->fCompl0 = (unsigned)(Abc_LitIsCompl(iLit1));
    }
    if ( p->pFanData )
    {
        Gia_ObjAddFanout( p, Gia_ObjFanin0(pObj), pObj );
        Gia_ObjAddFanout( p, Gia_ObjFanin1(pObj), pObj );
    }
    if ( p->fSweeper )
    {
        Gia_Obj_t * pFan0 = Gia_ObjFanin0(pObj);
        Gia_Obj_t * pFan1 = Gia_ObjFanin1(pObj);
        if ( pFan0->fMark0 ) pFan0->fMark1 = 1; else pFan0->fMark0 = 1;
        if ( pFan1->fMark0 ) pFan1->fMark1 = 1; else pFan1->fMark0 = 1;
        pObj->fPhase = (Gia_ObjPhase(pFan0) ^ Gia_ObjFaninC0(pObj)) & (Gia_ObjPhase(pFan1) ^ Gia_ObjFaninC1(pObj));
    }
    if ( p->fBuiltInSim )
    {
        Gia_Obj_t * pFan0 = Gia_ObjFanin0(pObj);
        Gia_Obj_t * pFan1 = Gia_ObjFanin1(pObj);
        pObj->fPhase = (Gia_ObjPhase(pFan0) ^ Gia_ObjFaninC0(pObj)) & (Gia_ObjPhase(pFan1) ^ Gia_ObjFaninC1(pObj));
        Gia_ManBuiltInSimPerform( p, Gia_ObjId( p, pObj ) );
    }
    if ( p->vSuppWords )
        Gia_ManQuantSetSuppAnd( p, pObj );
    return Gia_ObjId( p, pObj ) << 1;
}